

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::crossover_selection(Population *this,double crossover_rate)

{
  int iVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  reference this_00;
  reference other;
  undefined1 auVar3 [16];
  Chromosome *ch2;
  Chromosome *ch1;
  iterator r;
  iterator current;
  long local_28;
  long left;
  int crossover_count;
  double crossover_rate_local;
  Population *this_local;
  
  sVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes);
  auVar3._8_4_ = (int)(sVar2 >> 0x20);
  auVar3._0_8_ = sVar2;
  auVar3._12_4_ = 0x45300000;
  left._4_4_ = (int)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
                    crossover_rate);
  __first = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(&this->chromosomes);
  __last = std::vector<Chromosome,_std::allocator<Chromosome>_>::end(&this->chromosomes);
  local_28 = std::
             distance<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>
                       ((__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                         )__first._M_current,
                        (__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                         )__last._M_current);
  r = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(&this->chromosomes);
  while (left._4_4_ != 0) {
    ch1 = r._M_current;
    iVar1 = rand();
    std::
    advance<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>,long>
              ((__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                *)&ch1,(long)iVar1 % local_28);
    this_00 = __gnu_cxx::
              __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
              ::operator*(&r);
    other = __gnu_cxx::
            __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>::
            operator*((__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                       *)&ch1);
    if (this_00->id != other->id) {
      Chromosome::crossover(this_00,other);
      left._4_4_ = left._4_4_ + -1;
    }
    __gnu_cxx::
    __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>::
    operator++(&r);
    local_28 = local_28 + -1;
  }
  return;
}

Assistant:

void Population::crossover_selection(double crossover_rate) {

    // 0.25 der chromosome.
    //Fisher-Yates shuffle
    int crossover_count = (int) (chromosomes.size() * crossover_rate );
    //std::cout << crossover_count << std::endl;

    long left = std::distance(chromosomes.begin(), chromosomes.end());
    auto current = chromosomes.begin();

    while (crossover_count) {
        auto r = current;
        std::advance(r, rand()%left);
        //std::swap(*current, *r);
        Chromosome& ch1 = (*(current));
        Chromosome& ch2 = (*(r));

        if(ch1.id != ch2.id){
            ch1.crossover(ch2);
            --crossover_count;
        }
        ++current;
        --left;
    }

  /*  for(auto it = chromosomes.begin(); it < current; it +=2) {
        Chromosome& ch1 = (*(it));
        Chromosome& ch2 = *(it +1);
        ch1.crossover(ch2);
    }*/

}